

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::EnqueueSignal
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IFence *pFence,Uint64 Value,
          int param_3)

{
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == true) {
    FormatString<char[57]>
              (&local_30,(char (*) [57])"Fence signal can only be enqueued from immediate context");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a4);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (pFence == (IFence *)0x0) {
    FormatString<char[23]>(&local_30,(char (*) [23])0x6f0792);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a5);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EnqueueSignal(IFence* pFence, Uint64 Value, int)
{
    DEV_CHECK_ERR(!IsDeferred(), "Fence signal can only be enqueued from immediate context");
    DEV_CHECK_ERR(pFence != nullptr, "Fence must not be null");
}